

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

int Ssw_MiterStatus(Aig_Man_t *p,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  int level;
  Aig_Man_t *p_00;
  int i;
  uint uVar5;
  
  i = 0;
  uVar5 = 0;
  uVar3 = 0;
  uVar4 = 0;
  p_00 = p;
  while( true ) {
    level = (int)p_00;
    if (p->nTruePos <= i) break;
    p_00 = (Aig_Man_t *)p->vCos;
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)p_00,i);
    pAVar1 = *(Aig_Obj_t **)((long)pvVar2 + 8);
    if (pAVar1 == (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
      uVar5 = uVar5 + 1;
    }
    else if ((pAVar1 == p->pConst1) ||
            (((p->nRegs == 0 && ((*(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 7) == 2))
             || ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
                 != 0)))) {
      uVar3 = uVar3 + 1;
    }
    else {
      uVar4 = uVar4 + 1;
    }
    i = i + 1;
  }
  if (fVerbose != 0) {
    Abc_Print(level,"Miter has %d outputs. ");
    Abc_Print(level,"Const0 = %d.  ",(ulong)uVar5);
    Abc_Print(level,"NonConst0 = %d.  ",(ulong)uVar3);
    Abc_Print(level,"Undecided = %d.  ",(ulong)uVar4);
    Abc_Print(level,"\n");
  }
  uVar4 = -(uint)(uVar4 != 0) | 1;
  if (uVar3 != 0) {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_MiterStatus( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
//    if ( p->pData )
//        return 0;
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( p->nRegs == 0 && Aig_ObjIsCi(Aig_Regular(pChild)) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }

    if ( fVerbose )
    {
        Abc_Print( 1, "Miter has %d outputs. ", Saig_ManPoNum(p) );
        Abc_Print( 1, "Const0 = %d.  ", CountConst0 );
        Abc_Print( 1, "NonConst0 = %d.  ", CountNonConst0 );
        Abc_Print( 1, "Undecided = %d.  ", CountUndecided );
        Abc_Print( 1, "\n" );
    }

    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}